

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

bool DLevelScript::DoCheckActorTexture(int tid,AActor *activator,int string,bool floor)

{
  double x;
  double y;
  double bottomz;
  char *texname;
  FTexture *pFVar1;
  FTextureID *pFVar2;
  FTexture *pFVar3;
  sector_t *resultsec;
  F3DFloor *resffloor;
  sector_t_conflict *local_30;
  F3DFloor *local_28;
  
  if (tid != 0) {
    for (activator = AActor::TIDHash[tid & 0x7f];
        (activator != (AActor *)0x0 && (activator->tid != tid)); activator = activator->inext) {
    }
  }
  if (activator != (AActor *)0x0) {
    texname = FBehavior::StaticLookupString(string);
    pFVar1 = FTextureManager::FindTexture(&TexMan,texname,2,0x23);
    if (pFVar1 != (FTexture *)0x0) {
      x = (activator->__Pos).X;
      y = (activator->__Pos).Y;
      bottomz = (activator->__Pos).Z;
      if (floor) {
        sector_t::NextLowestFloorAt
                  (activator->Sector,x,y,bottomz,0,activator->MaxStepHeight,&local_30,&local_28);
        if (local_28 == (F3DFloor *)0x0) {
          pFVar2 = &local_30->planes[0].Texture;
        }
        else {
          pFVar2 = (local_28->top).texture;
        }
      }
      else {
        sector_t::NextHighestCeilingAt
                  (activator->Sector,x,y,bottomz,activator->Height + bottomz,0,&local_30,&local_28);
        if (local_28 == (F3DFloor *)0x0) {
          pFVar2 = &local_30->planes[1].Texture;
        }
        else {
          pFVar2 = (local_28->bottom).texture;
        }
      }
      if ((uint)pFVar2->texnum < TexMan.Textures.Count) {
        pFVar3 = TexMan.Textures.Array[pFVar2->texnum].Texture;
      }
      else {
        pFVar3 = (FTexture *)0x0;
      }
      return pFVar1 == pFVar3;
    }
  }
  return false;
}

Assistant:

bool DLevelScript::DoCheckActorTexture(int tid, AActor *activator, int string, bool floor)
{
	AActor *actor = SingleActorFromTID(tid, activator);
	if (actor == NULL)
	{
		return 0;
	}
	FTexture *tex = TexMan.FindTexture(FBehavior::StaticLookupString(string), FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny|FTextureManager::TEXMAN_DontCreate);

	if (tex == NULL)
	{ // If the texture we want to check against doesn't exist, then
	  // they're obviously not the same.
		return 0;
	}
	FTextureID secpic;
	sector_t *resultsec;
	F3DFloor *resffloor;

	if (floor)
	{
		actor->Sector->NextLowestFloorAt(actor->X(), actor->Y(), actor->Z(), 0, actor->MaxStepHeight, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->top.texture : resultsec->planes[sector_t::floor].Texture;
	}
	else
	{
		actor->Sector->NextHighestCeilingAt(actor->X(), actor->Y(), actor->Z(), actor->Top(), 0, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->bottom.texture : resultsec->planes[sector_t::ceiling].Texture;
	}
	return tex == TexMan[secpic];
}